

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O0

CmdLineItem * __thiscall Omega_h::CmdLineFlag::arg(CmdLineFlag *this,string *arg_name)

{
  bool bVar1;
  __type _Var2;
  reference this_00;
  pointer pCVar3;
  string *__lhs;
  unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_> *the_arg;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
  *__range1;
  string *arg_name_local;
  CmdLineFlag *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
           ::begin(&this->args_);
  the_arg = (unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_> *)
            std::
            vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
            ::end(&this->args_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_*,_std::vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>_>
                                *)&the_arg);
    if (!bVar1) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_cmdline.cpp"
           ,0x82);
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_*,_std::vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>_>
              ::operator*(&__end1);
    pCVar3 = std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>::
             operator->(this_00);
    __lhs = CmdLineItem::name_abi_cxx11_(pCVar3);
    _Var2 = std::operator==(__lhs,arg_name);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_*,_std::vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>_>
    ::operator++(&__end1);
  }
  pCVar3 = std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>::get
                     (this_00);
  return pCVar3;
}

Assistant:

CmdLineItem* CmdLineFlag::arg(std::string const& arg_name) {
  for (auto const& the_arg : args_)
    if (the_arg->name() == arg_name) return the_arg.get();
  OMEGA_H_NORETURN(nullptr);
}